

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

ScriptPtr * FBehavior::StaticFindScript(int script,FBehavior **module)

{
  FBehavior *this;
  FBehavior **ppFVar1;
  ScriptPtr *pSVar2;
  ulong uVar3;
  ulong uVar4;
  
  ppFVar1 = StaticModules.Array;
  uVar3 = (ulong)StaticModules.Count;
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      this = ppFVar1[uVar4];
      pSVar2 = FindScript(this,script);
      if (pSVar2 != (ScriptPtr *)0x0) {
        *module = this;
        return pSVar2;
      }
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  return (ScriptPtr *)0x0;
}

Assistant:

const ScriptPtr *FBehavior::StaticFindScript (int script, FBehavior *&module)
{
	for (DWORD i = 0; i < StaticModules.Size(); ++i)
	{
		const ScriptPtr *code = StaticModules[i]->FindScript (script);
		if (code != NULL)
		{
			module = StaticModules[i];
			return code;
		}
	}
	return NULL;
}